

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void __thiscall
Widget_Browser::item_draw(Widget_Browser *this,void *v,int X,int Y,int param_4,int param_5)

{
  uint uVar1;
  uint uVar2;
  Fl_Color FVar3;
  int iVar4;
  Fl_Color FVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  Fl_Pixmap *pFVar9;
  int iVar10;
  uint x;
  double dVar12;
  double extraout_XMM0_Qa;
  char buf [340];
  char local_188 [344];
  ulong uVar11;
  
  iVar10 = X + *(int *)((long)v + 0x48) * 0xc;
  x = iVar10 + 0x22;
  uVar11 = (ulong)x;
  uVar1 = (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.w_;
  FVar5 = 0;
  if ((show_comments == 0) || (*(char **)((long)v + 0x30) == (char *)0x0)) {
    iVar7 = 0;
  }
  else {
    copy_trunc(local_188,*(char **)((long)v + 0x30),0x50,0);
    iVar4 = (this->super_Fl_Browser_).textsize_;
    iVar7 = iVar4 + -1;
    FVar3 = 0xf;
    if (*(char *)((long)v + 0x40) == '\0') {
      FVar3 = (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.color_;
    }
    FVar3 = fl_contrast(0x3c,FVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)((this->super_Fl_Browser_).textfont_ + 2),
               (ulong)((this->super_Fl_Browser_).textsize_ - 2));
    fl_draw(local_188,x,Y + 0xc);
    iVar4 = (iVar4 - (iVar7 >> 0x1f)) + -1 >> 1;
    Y = Y + iVar4;
    iVar7 = iVar7 - iVar4;
  }
  if (*(char *)((long)v + 0x40) != '\0') {
    FVar5 = fl_contrast(0,0xf);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
  iVar4 = (**(code **)(*v + 0xb0))(v);
  if (iVar4 != 0) {
    if ((*(long *)((long)v + 0x50) == 0) ||
       (*(int *)(*(long *)((long)v + 0x50) + 0x48) <= *(int *)((long)v + 0x48))) {
      if ((int)*(char *)((long)v + 0x42) == (uint)(pushedtitle == (Fl_Type *)v)) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x14])
                  (fl_graphics_driver,(ulong)(iVar10 + 5U),(ulong)(Y + 2),(ulong)(iVar10 + 10),
                   (ulong)(Y + 7),(ulong)(iVar10 + 5U),Y + 0xc);
      }
      else {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x14])
                  (fl_graphics_driver,(ulong)(iVar10 + 3),(ulong)(Y + 7U),(ulong)(iVar10 + 8),
                   (ulong)(Y + 0xc),(ulong)(iVar10 + 0xd),Y + 7U);
      }
    }
    else if ((int)*(char *)((long)v + 0x42) == (uint)(pushedtitle == (Fl_Type *)v)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)(iVar10 + 5U),(ulong)(Y + 2),(ulong)(iVar10 + 10),
                 (ulong)(Y + 7),(ulong)(iVar10 + 5U),Y + 0xc);
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])();
    }
  }
  iVar4 = (**(code **)(*v + 0x140))(v);
  pFVar9 = pixmap[iVar4];
  if (pFVar9 != (Fl_Pixmap *)0x0) {
    (*(pFVar9->super_Fl_Image)._vptr_Fl_Image[7])
              (pFVar9,(ulong)(iVar10 + 0x10),(ulong)(uint)Y,(ulong)(uint)(pFVar9->super_Fl_Image).w_
               ,(ulong)(uint)(pFVar9->super_Fl_Image).h_,0,0);
  }
  iVar4 = (**(code **)(*v + 0x138))(v);
  if (iVar4 == 0) {
    pFVar9 = &lock_pixmap;
LAB_00180474:
    (*(pFVar9->super_Fl_Image)._vptr_Fl_Image[7])
              (pFVar9,(ulong)(iVar10 + 0x11),(ulong)(uint)Y,(ulong)(uint)(pFVar9->super_Fl_Image).w_
               ,(ulong)(uint)(pFVar9->super_Fl_Image).h_,0,0);
  }
  else if (iVar4 == 2) {
    pFVar9 = &protected_pixmap;
    goto LAB_00180474;
  }
  iVar7 = iVar7 + Y;
  iVar10 = (**(code **)(*v + 0xb8))(v);
  if ((iVar10 == 0) && (iVar10 = (**(code **)(*v + 0x130))(v), iVar10 == 0)) {
    pcVar6 = (char *)(**(code **)(*v + 0x20))(v);
    uVar8 = 0;
    copy_trunc(local_188,pcVar6,0x37,0);
    uVar2 = (this->super_Fl_Browser_).textfont_;
    iVar10 = (**(code **)(*v + 0x118))(v);
    if (iVar10 == 0) {
      uVar8 = 1;
    }
    else if (*(int *)((long)v + 0x48) != 0) {
      iVar10 = (**(code **)(**(long **)((long)v + 0x38) + 0x130))();
      uVar8 = (uint)(iVar10 == 0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uVar8 | uVar2),
               (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    pcVar6 = local_188;
  }
  else {
    pcVar6 = subclassname((Fl_Type *)v);
    iVar10 = strncmp(pcVar6,"Fl_",3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Browser_).textfont_,
               (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    fl_draw(pcVar6 + (ulong)(iVar10 == 0) * 3,x,iVar7 + 0xd);
    dVar12 = fl_width(pcVar6 + (ulong)(iVar10 == 0) * 3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6e);
    x = (int)(extraout_XMM0_Qa + dVar12) + x;
    pcVar6 = *(char **)((long)v + 8);
    if (pcVar6 == (char *)0x0) {
      if (*(char **)((long)v + 0x10) == (char *)0x0) goto LAB_001805ba;
      pcVar6 = local_188;
      copy_trunc(pcVar6,*(char **)((long)v + 0x10),0x14,1);
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,(ulong)((this->super_Fl_Browser_).textfont_ | 1),
                 (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    }
  }
  fl_draw(pcVar6,x,iVar7 + 0xd);
LAB_001805ba:
  if (*(char *)((long)v + 0x40) == '\0') {
    FVar5 = fl_color_average(0x31,0xff,0.67);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,uVar11,(ulong)(iVar7 + 0x10U),(ulong)uVar1,(ulong)(iVar7 + 0x10U))
    ;
  }
  return;
}

Assistant:

void Widget_Browser::item_draw(void *v, int X, int Y, int, int) const {
  // cast to a more general type
  Fl_Type *l = (Fl_Type *)v;

  char buf[340]; // edit buffer: large enough to hold 80 UTF-8 chars + nul

  // calculate the horizontal start position of this item
  // 3 is the edge of the browser
  // 13 is the width of the arrow that indicates children for the item
  // 18 is the width of the icon
  // 12 is the indent per level
  X += 3 + 13 + 18 + l->level * 12;

  // calculate the horizontal start position and width of the separator line
  int x1 = X;
  int w1 = w() - x1;

  // items can contain a comment. If they do, the comment gets a second text
  // line inside this browser line
  int comment_incr = 0;
  if (show_comments && l->comment()) {
    copy_trunc(buf, l->comment(), 80, 0);
    comment_incr = textsize()-1;
    if (l->new_selected) fl_color(fl_contrast(FL_DARK_GREEN,FL_SELECTION_COLOR));
    else fl_color(fl_contrast(FL_DARK_GREEN,color()));
    fl_font(textfont()+FL_ITALIC, textsize()-2);
    fl_draw(buf, X, Y+12);
    Y += comment_incr/2;
    comment_incr -= comment_incr/2;
  }
  
  if (l->new_selected) fl_color(fl_contrast(FL_FOREGROUND_COLOR,FL_SELECTION_COLOR));
  else fl_color(FL_FOREGROUND_COLOR);
  
  // Width=10: Draw the triangle that indicates possible children
  if (l->is_parent()) {
    X = X - 18 - 13;
    if (!l->next || l->next->level <= l->level) {
      if (l->open_!=(l==pushedtitle)) {
        // an outlined triangle to the right indicates closed item, no children
        fl_loop(X,Y+7,X+5,Y+12,X+10,Y+7);
      } else {
        // an outlined triangle to the bottom indicates open item, no children
        fl_loop(X+2,Y+2,X+7,Y+7,X+2,Y+12);
      }
    } else {
      if (l->open_!=(l==pushedtitle)) {
        // a filled triangle to the right indicates closed item, with children
        fl_polygon(X,Y+7,X+5,Y+12,X+10,Y+7);
      } else {
        // a filled triangle to the bottom indicates open item, with children
        fl_polygon(X+2,Y+2,X+7,Y+7,X+2,Y+12);
      }
    }
    X = X + 13 + 18;
  }
  
  // Width=18: Draw the icon associated with the type.
  Fl_Pixmap *pm = pixmap[l->pixmapID()];
  if (pm) pm->draw(X-18, Y);
  
  // Add tags on top of the icon for locked and protected types.
  switch (l->is_public()) {
    case 0: lock_pixmap.draw(X - 17, Y); break;
    case 2: protected_pixmap.draw(X - 17, Y); break;
  }
  
  // Indent=12 per level: Now write the text that comes after the graphics representation
  Y += comment_incr;
  if (l->is_widget() || l->is_class()) {
    const char* c = subclassname(l);
    if (!strncmp(c,"Fl_",3)) c += 3;
    fl_font(textfont(), textsize());
    fl_draw(c, X, Y+13);
    X += int(fl_width(c)+fl_width('n'));
    c = l->name();
    if (c) {
      fl_font(textfont()|FL_BOLD, textsize());
      fl_draw(c, X, Y+13);
    } else if ((c = l->label())) {
      copy_trunc(buf, c, 20, 1); // quoted string
      fl_draw(buf, X, Y+13);
    }
  } else {
    copy_trunc(buf, l->title(), 55, 0);
    fl_font(textfont() | (l->is_code_block() && (l->level==0 || l->parent->is_class())?0:FL_BOLD), textsize());
    fl_draw(buf, X, Y+13);
  }

  // draw a thin line below the item if this item is not selected
  // (if it is selected this additional line would look bad)
  if (!l->new_selected) {
    fl_color(fl_lighter(FL_GRAY));
    fl_line(x1,Y+16,x1+w1,Y+16);
  }
}